

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall iu_AssertionTest_x_iutest_x_GE_Test::Body(iu_AssertionTest_x_iutest_x_GE_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double *in_R9;
  AssertionHelper local_7d0;
  Fixed local_7a0;
  undefined1 local_618 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5c0;
  int local_438;
  char local_434 [4];
  undefined1 local_430 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3d8;
  undefined1 local_250 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_220;
  Fixed local_1f0;
  undefined1 local_58 [8];
  AssertionResult iutest_ar;
  double d1;
  double d0;
  float f1;
  float f0;
  int y0;
  int x0;
  iu_AssertionTest_x_iutest_x_GE_Test *this_local;
  
  f0 = 0.0;
  f1 = 0.0;
  d0._4_4_ = 0;
  d0._0_4_ = 0x3f800000;
  d1 = 0.0;
  iutest_ar.m_result = false;
  iutest_ar._33_7_ = 0x3ff00000000000;
  _y0 = this;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperGE<int,int>
            ((AssertionResult *)local_58,(internal *)"x0","y0",(char *)&f0,(int *)&f1,(int *)in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_58);
    iutest::AssertionHelper::AssertionHelper
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0xb4,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_220,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper(&local_220);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperGE<float,float>
              ((AssertionResult *)local_250,(internal *)0x544b8c,"f0",(char *)&d0,
               (float *)((long)&d0 + 4),(float *)in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      memset(&local_3d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_250);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xb5,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3d8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    iutest::detail::AlwaysZero();
    local_434[0] = '\x01';
    local_434[1] = '\0';
    local_434[2] = '\0';
    local_434[3] = '\0';
    local_438 = 0;
    iutest::internal::CmpHelperGE<int,float>
              ((AssertionResult *)local_430,(internal *)"0x1","0.0f",local_434,&local_438,
               (float *)in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
    if (!bVar1) {
      memset(&local_5c0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5c0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_430);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xb6,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5c0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5c0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_430);
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperGE<double,double>
              ((AssertionResult *)local_618,(internal *)0x544bb6,"d0",&iutest_ar.m_result,&d1,in_R9)
    ;
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
    if (!bVar1) {
      memset(&local_7a0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7a0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_618);
      iutest::AssertionHelper::AssertionHelper
                (&local_7d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xb7,pcVar2,kWarning);
      iutest::AssertionHelper::operator=(&local_7d0,&local_7a0);
      iutest::AssertionHelper::~AssertionHelper(&local_7d0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7a0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, GE)
{
    int x0=0, y0=0;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_GE(x0, y0);
    IUTEST_EXPECT_GE(f1, f0);
    IUTEST_INFORM_GE(0x1, 0.0f);
    IUTEST_INFORM_GE(d1, d0);
}